

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::GatherBase::ComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  GatherBase *this_local;
  
  local_18 = this;
  this_local = (GatherBase *)__return_storage_ptr__;
  (**(code **)(*this + 0xb8))();
  std::operator+(&local_78,
                 "#version 400 core                                           \n#extension GL_ARB_shader_storage_buffer_object : require    \n#extension GL_ARB_compute_shader : require            \n#extension GL_ARB_texture_cube_map_array : enable     \nlayout(local_size_x = 1, local_size_y = 1) in;        \nlayout(std430) buffer Output {                        \n  "
                 ,&local_98);
  std::operator+(&local_58,&local_78,
                 " data;                                \n} g_out;                                              \nuniform vec4 cs_in;                                   \n"
                );
  (**(code **)(*this + 0xb0))(&local_c8);
  std::operator+(&local_38,&local_58,&local_c8);
  std::operator+(__return_storage_ptr__,&local_38,
                 "void main() {                                         \n  g_out.data = test_function(cs_in);                  \n}                                                     \n"
                );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ComputeShader()
	{
		return "#version 400 core                                           \n"
			   "#extension GL_ARB_shader_storage_buffer_object : require    \n"
			   "#extension GL_ARB_compute_shader : require            \n"
			   "#extension GL_ARB_texture_cube_map_array : enable     \n"
			   "layout(local_size_x = 1, local_size_y = 1) in;        \n"
			   "layout(std430) buffer Output {                        \n"
			   "  " +
			   Type() + " data;                                \n"
						"} g_out;                                              \n"
						"uniform vec4 cs_in;                                   \n" +
			   TestFunction() + "void main() {                                         \n"
								"  g_out.data = test_function(cs_in);                  \n"
								"}                                                     \n";
	}